

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convey.c
# Opt level: O0

char * convey_nextline(char **next)

{
  char *pcStack_28;
  char c;
  char *nl;
  char *line;
  char **next_local;
  
  nl = *next;
  pcStack_28 = nl;
  if (nl == (char *)0x0) {
    next_local = (char **)0x0;
  }
  else {
    for (; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
      if (*pcStack_28 == '\n') {
        *pcStack_28 = '\0';
        *next = pcStack_28 + 1;
        return nl;
      }
    }
    if (*nl == '\0') {
      nl = (char *)0x0;
    }
    *next = (char *)0x0;
    next_local = (char **)nl;
  }
  return (char *)next_local;
}

Assistant:

static char *
convey_nextline(char **next)
{
	char *line = *next;
	char *nl;
	char  c;

	if (line == NULL) {
		return (NULL);
	}
	for (nl = line; (c = (*nl)) != '\0'; nl++) {
		if (c == '\n') {
			*nl   = '\0';
			*next = nl + 1;
			return (line);
		}
	}

	/*
	 * If the last character in the file is a newline, treat it as
	 * the end.  (This will appear as a blank last line.)
	 */
	if (*line == '\0') {
		line = NULL;
	}
	*next = NULL;
	return (line);
}